

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

sei_message_t * sei_message_new(sei_msgtype_t type,uint8_t *data,size_t size)

{
  sei_message_t *msg_00;
  uint8_t *puVar1;
  size_t in_RDX;
  void *in_RSI;
  sei_msgtype_t in_EDI;
  _sei_message_t *msg;
  
  msg_00 = (sei_message_t *)malloc(in_RDX + 0x18);
  msg_00->next = (_sei_message_t *)0x0;
  msg_00->type = in_EDI;
  msg_00->size = in_RDX;
  if (in_RSI == (void *)0x0) {
    puVar1 = sei_message_data(msg_00);
    memset(puVar1,0,in_RDX);
  }
  else {
    puVar1 = sei_message_data(msg_00);
    memcpy(puVar1,in_RSI,in_RDX);
  }
  return msg_00;
}

Assistant:

sei_message_t* sei_message_new(sei_msgtype_t type, uint8_t* data, size_t size)
{
    struct _sei_message_t* msg = (struct _sei_message_t*)malloc(sizeof(struct _sei_message_t) + size);
    msg->next = 0;
    msg->type = type;
    msg->size = size;

    if (data) {
        memcpy(sei_message_data(msg), data, size);
    } else {
        memset(sei_message_data(msg), 0, size);
    }

    return (sei_message_t*)msg;
}